

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

hwaddr s390_cpu_get_phys_addr_debug(CPUState *cs,vaddr vaddr)

{
  hwaddr hVar1;
  target_ulong page;
  hwaddr phys_addr;
  vaddr vaddr_local;
  CPUState *cs_local;
  
  hVar1 = cpu_get_phys_page_debug(cs,vaddr & 0xfffffffffffff000);
  return (vaddr & 0xfff) + hVar1;
}

Assistant:

hwaddr s390_cpu_get_phys_addr_debug(CPUState *cs, vaddr vaddr)
{
    hwaddr phys_addr;
    target_ulong page;

    page = vaddr & TARGET_PAGE_MASK;
    phys_addr = cpu_get_phys_page_debug(cs, page);
    phys_addr += (vaddr & ~TARGET_PAGE_MASK);

    return phys_addr;
}